

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

Tensor * google::protobuf::internal::GenericTypeHandler<CoreML::Specification::Tensor>::New
                   (Arena *arena)

{
  Arena *arena_local;
  Tensor *local_28;
  Tensor *t;
  
  if (arena == (Arena *)0x0) {
    local_28 = (Tensor *)operator_new(0x30);
    CoreML::Specification::Tensor::Tensor(local_28);
  }
  else {
    local_28 = (Tensor *)
               Arena::AllocateAligned
                         (arena,(type_info *)&CoreML::Specification::Tensor::typeinfo,0x30);
    CoreML::Specification::Tensor::Tensor(local_28);
    Arena::AddListNode(arena,local_28,arena_destruct_object<CoreML::Specification::Tensor>);
  }
  return local_28;
}

Assistant:

static inline GenericType* New(Arena* arena) {
    return ::google::protobuf::Arena::CreateMaybeMessage<Type>(
        arena, static_cast<GenericType*>(0));
  }